

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O0

int Mio_LibraryReadGateNameMax(Mio_Library_t *pLib)

{
  char *__s;
  size_t sVar1;
  undefined4 local_1c;
  int LenCur;
  int LenMax;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  
  local_1c = 0;
  for (_LenCur = Mio_LibraryReadGates(pLib); _LenCur != (Mio_Gate_t *)0x0;
      _LenCur = Mio_GateReadNext(_LenCur)) {
    __s = Mio_GateReadName(_LenCur);
    sVar1 = strlen(__s);
    if (local_1c < (int)sVar1) {
      local_1c = (int)sVar1;
    }
  }
  return local_1c;
}

Assistant:

int Mio_LibraryReadGateNameMax( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    int LenMax = 0, LenCur;
    Mio_LibraryForEachGate( pLib, pGate )
    {
        LenCur = strlen( Mio_GateReadName(pGate) );
        if ( LenMax < LenCur )
            LenMax = LenCur;
    }
    return LenMax;
}